

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_singlefile.c
# Opt level: O3

void test_singlefile(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_singlefile.zip");
  wVar1 = systemf("%s %s >test.out 2>test.err",testprog,"test_singlefile.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_singlefile.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_singlefile.c"
             ,L'\x12',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_singlefile.c"
             ,L'\x13',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_singlefile.c"
             ,L'\x15',"hello\n","file.txt");
  return;
}

Assistant:

DEFINE_TEST(test_singlefile)
{
	const char *reffile = "test_singlefile.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("hello\n", "file.txt");
}